

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

vector<crnlib::dynamic_string> * __thiscall
crnlib::vector<crnlib::dynamic_string>::operator=
          (vector<crnlib::dynamic_string> *this,vector<crnlib::dynamic_string> *other)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  dynamic_string *pdVar4;
  dynamic_string *this_00;
  long lVar5;
  
  if (this != other) {
    if (this->m_capacity < other->m_size) {
      pdVar4 = this->m_p;
      if (pdVar4 != (dynamic_string *)0x0) {
        uVar1 = this->m_size;
        if ((ulong)uVar1 != 0) {
          lVar5 = 0;
          do {
            lVar2 = *(long *)((long)&pdVar4->m_pStr + lVar5);
            if ((lVar2 != 0) && ((*(uint *)(lVar2 + -8) ^ *(uint *)(lVar2 + -4)) == 0xffffffff)) {
              crnlib_free((void *)(lVar2 + -0x10));
            }
            lVar5 = lVar5 + 0x10;
          } while ((ulong)uVar1 << 4 != lVar5);
        }
        crnlib_free(this->m_p);
        this->m_p = (dynamic_string *)0x0;
        this->m_size = 0;
        this->m_capacity = 0;
      }
      elemental_vector::increase_capacity
                ((elemental_vector *)this,other->m_size,false,0x10,(object_mover)0x0,false);
    }
    else {
      uVar1 = this->m_size;
      if ((ulong)uVar1 != 0) {
        pdVar4 = this->m_p;
        lVar5 = 0;
        do {
          lVar2 = *(long *)((long)&pdVar4->m_pStr + lVar5);
          if ((lVar2 != 0) && ((*(uint *)(lVar2 + -8) ^ *(uint *)(lVar2 + -4)) == 0xffffffff)) {
            crnlib_free((void *)(lVar2 + -0x10));
          }
          lVar5 = lVar5 + 0x10;
        } while ((ulong)uVar1 << 4 != lVar5);
        this->m_size = 0;
      }
    }
    uVar3 = other->m_size;
    if (uVar3 != 0) {
      pdVar4 = other->m_p;
      this_00 = this->m_p;
      do {
        dynamic_string::dynamic_string(this_00,pdVar4);
        uVar3 = uVar3 - 1;
        pdVar4 = pdVar4 + 1;
        this_00 = this_00 + 1;
      } while (uVar3 != 0);
    }
    this->m_size = other->m_size;
  }
  return this;
}

Assistant:

inline vector& operator=(const vector& other)
        {
            if (this == &other)
            {
                return *this;
            }

            if (m_capacity >= other.m_size)
            {
                resize(0);
            }
            else
            {
                clear();
                increase_capacity(other.m_size, false);
            }

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
            }
            else
            {
                T* pDst = m_p;
                const T* pSrc = other.m_p;
                for (uint i = other.m_size; i > 0; i--)
                {
                    helpers::construct(pDst++, *pSrc++);
                }
            }

            m_size = other.m_size;

            return *this;
        }